

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

int av1_get_force_skip_low_temp_var_small_sb
              (uint8_t *variance_low,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  uint uVar1;
  uint uVar2;
  int force_skip_low_temp_var;
  int j;
  int i;
  int mi_y;
  int mi_x;
  BLOCK_SIZE bsize_local;
  int mi_col_local;
  int mi_row_local;
  uint8_t *variance_low_local;
  
  uVar1 = mi_row & 0xf;
  uVar2 = mi_col & 0xf;
  force_skip_low_temp_var = 0;
  switch(bsize) {
  case BLOCK_16X16:
  case BLOCK_16X32:
  case BLOCK_32X16:
    force_skip_low_temp_var = (int)variance_low[pos_shift_16x16[(int)uVar1 >> 2][(int)uVar2 >> 2]];
    break;
  case BLOCK_32X32:
    if ((uVar2 == 0) && (uVar1 == 0)) {
      force_skip_low_temp_var = (int)variance_low[5];
    }
    else if ((uVar2 == 0) || (uVar1 != 0)) {
      if ((uVar2 == 0) && (uVar1 != 0)) {
        force_skip_low_temp_var = (int)variance_low[7];
      }
      else if ((uVar2 != 0) && (uVar1 != 0)) {
        force_skip_low_temp_var = (int)variance_low[8];
      }
    }
    else {
      force_skip_low_temp_var = (int)variance_low[6];
    }
    break;
  case BLOCK_32X64:
    if ((uVar2 == 0) && (uVar1 == 0)) {
      force_skip_low_temp_var = (int)variance_low[3];
    }
    else if ((uVar2 != 0) && (uVar1 == 0)) {
      force_skip_low_temp_var = (int)variance_low[4];
    }
    break;
  case BLOCK_64X32:
    if ((uVar2 == 0) && (uVar1 == 0)) {
      force_skip_low_temp_var = (int)variance_low[1];
    }
    else if ((uVar2 == 0) && (uVar1 != 0)) {
      force_skip_low_temp_var = (int)variance_low[2];
    }
    break;
  case BLOCK_64X64:
    force_skip_low_temp_var = (int)*variance_low;
  }
  return force_skip_low_temp_var;
}

Assistant:

int av1_get_force_skip_low_temp_var_small_sb(const uint8_t *variance_low,
                                             int mi_row, int mi_col,
                                             BLOCK_SIZE bsize) {
  // Relative indices of MB inside the superblock.
  const int mi_x = mi_row & 0xF;
  const int mi_y = mi_col & 0xF;
  // Relative indices of 16x16 block inside the superblock.
  const int i = mi_x >> 2;
  const int j = mi_y >> 2;
  int force_skip_low_temp_var = 0;
  // Set force_skip_low_temp_var based on the block size and block offset.
  switch (bsize) {
    case BLOCK_64X64: force_skip_low_temp_var = variance_low[0]; break;
    case BLOCK_64X32:
      if (!mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[1];
      } else if (!mi_y && mi_x) {
        force_skip_low_temp_var = variance_low[2];
      }
      break;
    case BLOCK_32X64:
      if (!mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[3];
      } else if (mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[4];
      }
      break;
    case BLOCK_32X32:
      if (!mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[5];
      } else if (mi_y && !mi_x) {
        force_skip_low_temp_var = variance_low[6];
      } else if (!mi_y && mi_x) {
        force_skip_low_temp_var = variance_low[7];
      } else if (mi_y && mi_x) {
        force_skip_low_temp_var = variance_low[8];
      }
      break;
    case BLOCK_32X16:
    case BLOCK_16X32:
    case BLOCK_16X16:
      force_skip_low_temp_var = variance_low[pos_shift_16x16[i][j]];
      break;
    default: break;
  }

  return force_skip_low_temp_var;
}